

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O1

TPZCompEl * __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoPrism>::Clone
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoPrism> *this,TPZCompMesh *mesh)

{
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error at ",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "virtual TPZCompEl *TPZMultiphysicsCompEl<pzgeom::TPZGeoPrism>::Clone(TPZCompMesh &) const [TGeometry = pzgeom::TPZGeoPrism]"
             ,0x7b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr," method is not implementedl!\n",0x1d);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzmultiphysicscompel.cpp"
             ,0x158);
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::InitializeElementMatrix(TPZElementMatrix &ef)
{
    const int ncon = this->NConnects();
    ef.fMesh = Mesh();
    ef.fType = TPZElementMatrix::EF;
    int numeq = 0;
    int ic;
    
    for(ic=0; ic<ncon; ic++)
    {
        int64_t neqThisConn = Connect(ic).NDof(*Mesh());
        numeq += neqThisConn;
    }
    
    int64_t nref = this->fElementVec.size();
    int nstate = 0;
    //nstate=1;
    const int numloadcases = [this](){
        if (auto *tmp = dynamic_cast<TPZMatLoadCasesBase*>(this->Material()); tmp){
            return tmp->NumLoadCases();
        }else{
            return 1;
        }
    }();
    for (int64_t iref=0; iref<nref; iref++) {
        
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        if (! msp) {
            continue;
        }
        TPZMaterial *mat = msp->Material();
        nstate += mat->NStateVariables();
    }
    
    const int numstate = nstate;
    ef.Matrix().Redim(numeq,numloadcases);
    ef.Block().SetNBlocks(ncon);
    
    int i;
    for(i=0; i<ncon; i++){
        unsigned int ndof = Connect(i).NDof(*Mesh());
#ifdef PZDEBUG
        TPZConnect &c = Connect(i);
        if (c.NShape()*c.NState() != ndof) {
            DebugStop();
        }
#endif
        ef.Block().Set(i,ndof);
    }
    ef.fConnect.Resize(ncon);
    for(i=0; i<ncon; i++){
        (ef.fConnect)[i] = ConnectIndex(i);
    }
    ef.fOneRestraints = GetShapeRestraints();
}